

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
::Iterator::Current(Iterator *this)

{
  FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> *pFVar1;
  _func_void_short_ptr_short_ptr_short_ptr_int *p_Var2;
  undefined4 uVar3;
  FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> *pFVar4;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
      .
      super__Head_base<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_false>
      ._M_head_impl == (FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> *)0x0) {
    pFVar4 = (FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> *)operator_new(0x18);
    pFVar1 = (this->iterator_)._M_current;
    p_Var2 = pFVar1->tst_func;
    pFVar4->ref_func = pFVar1->ref_func;
    pFVar4->tst_func = p_Var2;
    uVar3 = *(undefined4 *)&pFVar1->field_0x14;
    pFVar4->bit_depth = pFVar1->bit_depth;
    *(undefined4 *)&pFVar4->field_0x14 = uVar3;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
    .
    super__Head_base<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_false>
    ._M_head_impl = pFVar4;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_std::default_delete<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
         .
         super__Head_base<0UL,_const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }